

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

void __thiscall Rml::DataViewText::Release(DataViewText *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  ::std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::
  ~vector(&this->data_entries);
  pcVar2 = (this->text)._M_dataplus._M_p;
  paVar1 = &(this->text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  DataView::~DataView(&this->super_DataView);
  operator_delete(this,0x50);
  return;
}

Assistant:

void DataViewText::Release()
{
	delete this;
}